

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::disconnectBeforeStartTimeFixture::disconnectBeforeStartTimeFixture
          (disconnectBeforeStartTimeFixture *this)

{
  int iVar1;
  ulong uVar2;
  DateTime d;
  long local_18;
  
  sessionFixture::sessionFixture((sessionFixture *)this,0);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_003280f0;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (_func_int **)&PTR__disconnectBeforeStartTimeFixture_00328148;
  FIX::DateTime::nowUtc();
  iVar1 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
          super_DateTime.m_date;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = iVar1 + 0x485;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_time = local_18 + 35200000000000U;
  if (local_18 < 0x2e90edd00001) {
    if (local_18 < -35200000000000) {
      (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime
      .m_date = iVar1 + 0x484;
      uVar2 = local_18 + 0x6e9834ce0000;
      goto LAB_002a45f7;
    }
  }
  else {
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    m_date = iVar1 + 0x486;
    uVar2 = (local_18 + 35200000000000U) % 86400000000000;
LAB_002a45f7:
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    m_time = uVar2;
  }
  FIX::DateTime::nowUtc();
  iVar1 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
          super_DateTime.m_date;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = iVar1 + 0x1215;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = local_18 + 54400000000000U;
  if (local_18 < 0x1d1a94a20001) {
    if (-0x3179fcad0001 < local_18) goto LAB_002a4690;
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    m_date = iVar1 + 0x1214;
    uVar2 = local_18 + 0x800e8dfc0000;
  }
  else {
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    m_date = iVar1 + 0x1216;
    uVar2 = (local_18 + 54400000000000U) % 86400000000000;
  }
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = uVar2;
LAB_002a4690:
  sessionFixture::createSession((sessionFixture *)this,0,-1,-1);
  return;
}

Assistant:

disconnectBeforeStartTimeFixture()
  {
    startTime.setCurrent();
    startTime += 100000000;
    endTime.setCurrent();
    endTime += 400000000;

    acceptorFixture::createSession( 0 );
  }